

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
spirv_cross::Compiler::get_common_basic_type(Compiler *this,SPIRType *type,BaseType *base_type)

{
  BaseType BVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)1> *pTVar3;
  bool bVar4;
  undefined8 in_RAX;
  SPIRType *pSVar5;
  long lVar6;
  bool bVar7;
  BaseType member_base;
  undefined8 uStack_38;
  
  BVar1 = *(BaseType *)&(type->super_IVariant).field_0xc;
  if (BVar1 == Struct) {
    *base_type = Unknown;
    sVar2 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    bVar7 = sVar2 == 0;
    if (!bVar7) {
      pTVar3 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
               ptr;
      uStack_38 = in_RAX;
      pSVar5 = Variant::get<spirv_cross::SPIRType>
                         ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + pTVar3->id);
      bVar4 = get_common_basic_type(this,pSVar5,(BaseType *)((long)&uStack_38 + 4));
      if (bVar4) {
        lVar6 = 4;
        do {
          if (*base_type == Unknown) {
            *base_type = uStack_38._4_4_;
          }
          else if (*base_type != uStack_38._4_4_) {
            return bVar7;
          }
          bVar7 = sVar2 << 2 == lVar6;
          if (bVar7) {
            return bVar7;
          }
          pSVar5 = Variant::get<spirv_cross::SPIRType>
                             ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                              *(uint *)((long)&pTVar3->id + lVar6));
          bVar4 = get_common_basic_type(this,pSVar5,(BaseType *)((long)&uStack_38 + 4));
          lVar6 = lVar6 + 4;
        } while (bVar4);
      }
    }
  }
  else {
    *base_type = BVar1;
    bVar7 = true;
  }
  return bVar7;
}

Assistant:

bool Compiler::get_common_basic_type(const SPIRType &type, SPIRType::BaseType &base_type)
{
	if (type.basetype == SPIRType::Struct)
	{
		base_type = SPIRType::Unknown;
		for (auto &member_type : type.member_types)
		{
			SPIRType::BaseType member_base;
			if (!get_common_basic_type(get<SPIRType>(member_type), member_base))
				return false;

			if (base_type == SPIRType::Unknown)
				base_type = member_base;
			else if (base_type != member_base)
				return false;
		}
		return true;
	}
	else
	{
		base_type = type.basetype;
		return true;
	}
}